

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

int64_t wallet::GetOldestKeyTimeInPool
                  (set<long,_std::less<long>,_std::allocator<long>_> *setKeyPool,WalletBatch *batch)

{
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  runtime_error *this;
  long in_FS_OFFSET;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  CKeyPool keypool;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((setKeyPool->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      iVar3 = GetTime();
      return iVar3;
    }
  }
  else {
    CKeyPool::CKeyPool(&keypool);
    bVar2 = WalletBatch::ReadPool
                      (batch,*(int64_t *)
                              ((setKeyPool->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left +
                              1),&keypool);
    if (bVar2) {
      if (((keypool.vchPubKey.vch[0] & 0xfe) != 2) &&
         ((7 < keypool.vchPubKey.vch[0] || ((0xd0U >> (keypool.vchPubKey.vch[0] & 0x1f) & 1) == 0)))
         ) {
        __assert_fail("keypool.vchPubKey.IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                      ,0x225,
                      "int64_t wallet::GetOldestKeyTimeInPool(const std::set<int64_t> &, WalletBatch &)"
                     );
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return keypool.nTime;
      }
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"GetOldestKeyTimeInPool",&local_b9);
      std::operator+(&local_98,&local_b8,": read oldest key in keypool failed");
      std::runtime_error::runtime_error(this,(string *)&local_98);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

static int64_t GetOldestKeyTimeInPool(const std::set<int64_t>& setKeyPool, WalletBatch& batch) {
    if (setKeyPool.empty()) {
        return GetTime();
    }

    CKeyPool keypool;
    int64_t nIndex = *(setKeyPool.begin());
    if (!batch.ReadPool(nIndex, keypool)) {
        throw std::runtime_error(std::string(__func__) + ": read oldest key in keypool failed");
    }
    assert(keypool.vchPubKey.IsValid());
    return keypool.nTime;
}